

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

void __thiscall asmjit::CodeHolder::setErrorHandler(CodeHolder *this,ErrorHandler *errorHandler)

{
  this->_errorHandler = errorHandler;
  CodeHolder_onSettingsUpdated(this);
  return;
}

Assistant:

void CodeHolder::setErrorHandler(ErrorHandler* errorHandler) noexcept {
  _errorHandler = errorHandler;
  CodeHolder_onSettingsUpdated(this);
}